

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall asl::SocketServer::startLoop(SocketServer *this)

{
  Socket *pSVar1;
  SockClientThread *this_00;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  Socket local_38 [3];
  Socket local_20;
  Socket client;
  int i;
  int n;
  SocketServer *this_local;
  
  do {
    client.super_SmartObject._p._4_4_ = Sockets::waitInput(&this->_sockets,2.0);
    if (0 < client.super_SmartObject._p._4_4_) {
      for (client.super_SmartObject._p._0_4_ = 0;
          (int)client.super_SmartObject._p < client.super_SmartObject._p._4_4_;
          client.super_SmartObject._p._0_4_ = (int)client.super_SmartObject._p + 1) {
        pSVar1 = Sockets::activeAt(&this->_sockets,(int)client.super_SmartObject._p);
        Socket::accept(&local_20,(int)pSVar1,__addr,in_RCX);
        AtomicCount::operator++(&this->_numClients);
        if ((this->_sequential & 1U) == 0) {
          this_00 = (SockClientThread *)operator_new(0x28);
          SockClientThread::SockClientThread(this_00,this,&local_20);
        }
        else {
          Socket::Socket(local_38,&local_20);
          __fd = (int)local_38;
          (**this->_vptr_SocketServer)();
          Socket::~Socket(local_38);
          Socket::close(&local_20,__fd);
          AtomicCount::operator--(&this->_numClients);
        }
        Socket::~Socket(&local_20);
      }
    }
  } while (((this->_requestStop & 1U) == 0) && (-1 < client.super_SmartObject._p._4_4_));
  this->_running = false;
  return;
}

Assistant:

void SocketServer::startLoop()
{
	int n;
	do
	{
		if ((n = _sockets.waitInput(2)) > 0)
		{
			for (int i = 0; i < n; i++)
			{
				Socket client = _sockets.activeAt(i).accept();
				++_numClients;
				if (_sequential) {
					serve(client);
					client.close();
					--_numClients;
				}
				else
					new SockClientThread(this, client);
			}
		}
		if(_requestStop || n < 0)
		{
			_running = false;
			break;
		}
		
	}
	while(true);
}